

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createQuadSphere
          (Vec3fa *center,float radius,size_t N,Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  _func_int **pp_Var5;
  reference pvVar6;
  unsigned_long *puVar7;
  Vec3fa *pVVar8;
  long *in_RCX;
  uint in_EDX;
  float *in_RSI;
  Node *in_RDI;
  float in_XMM0_Da;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  uint p11_1;
  uint p10_2;
  uint p01_1;
  uint p00_2;
  uint theta_3;
  uint p10_1;
  uint p01;
  uint p00_1;
  uint theta_2;
  uint p11;
  uint p10;
  uint p00;
  uint theta_1;
  float thetaf;
  float phif;
  uint theta;
  uint phi;
  float rcpNumPhi;
  float rcpNumTheta;
  Ref<embree::SceneGraph::QuadMeshNode> mesh;
  uint numVertices;
  uint numTheta;
  uint numPhi;
  __m128 r_1;
  __m128 a_1;
  __m128 r;
  __m128 a;
  size_t i_3;
  size_t i_2;
  Vec3fa *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  value_type *in_stack_fffffffffffffa08;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *in_stack_fffffffffffffa10;
  size_t in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  BBox1f in_stack_fffffffffffffab0;
  Quad local_48c;
  uint local_47c;
  uint local_478;
  uint local_474;
  uint local_470;
  uint local_46c;
  Quad local_468;
  uint local_458;
  uint local_454;
  uint local_450;
  uint local_44c;
  Quad local_448;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  float local_428;
  float local_424;
  uint local_420;
  uint local_41c;
  float local_418;
  float local_414;
  undefined1 local_40d;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 local_404;
  undefined4 uStack_400;
  long *local_3f0;
  _func_int **local_3e8;
  uint local_3dc;
  uint local_3d8;
  uint local_3d4;
  float local_3bc;
  float *local_3b8;
  long **local_3a0;
  undefined4 *local_398;
  undefined4 *local_390;
  undefined4 *local_388;
  long **local_380;
  ulong local_370;
  reference local_368;
  ulong local_360;
  reference local_358;
  ulong local_350;
  reference local_348;
  ulong local_340;
  reference local_338;
  _func_int **local_330;
  _func_int ***local_328;
  _func_int ***local_320;
  _func_int ***local_318;
  _func_int ***local_310;
  _func_int ***local_308;
  _func_int ***local_300;
  _func_int ***local_2f8;
  _func_int ***local_2f0;
  _func_int ***local_2e8;
  _func_int ***local_2d8;
  undefined1 local_2c8 [16];
  ulong local_2b8;
  undefined8 uStack_2b0;
  float local_29c;
  undefined1 local_298 [16];
  ulong local_288;
  undefined8 uStack_280;
  float local_274;
  undefined1 *local_270;
  undefined1 *local_268;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  undefined1 local_248 [16];
  undefined4 local_22c;
  undefined1 local_228 [16];
  float local_20c;
  undefined1 local_208 [16];
  undefined4 local_1ec;
  undefined1 local_1e8 [16];
  float local_1cc;
  ulong local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  ulong local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  ulong local_c0;
  Vec3fa *local_b8;
  ulong local_b0;
  ulong local_a8;
  size_t local_a0;
  ulong local_98;
  reference local_90;
  Vec3fa *local_88;
  Vec3fa *local_80;
  Vec3fa *local_78;
  Vec3fa *local_70;
  size_t local_68;
  Vec3fa *local_60;
  reference local_58;
  size_t local_50;
  reference local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  _func_int **local_10;
  
  local_3d8 = in_EDX * 2;
  local_3dc = local_3d8 * (in_EDX + 1);
  local_3d4 = in_EDX;
  local_3bc = in_XMM0_Da;
  local_3b8 = in_RSI;
  pp_Var5 = (_func_int **)::operator_new(0xd8);
  local_40d = 1;
  local_3a0 = &local_3f0;
  local_3f0 = (long *)*in_RCX;
  if (local_3f0 != (long *)0x0) {
    (**(code **)(*local_3f0 + 0x10))();
  }
  local_408 = 0;
  local_40c = 0x3f800000;
  local_388 = &local_404;
  local_390 = &local_408;
  local_398 = &local_40c;
  local_404 = 0;
  uStack_400 = 0x3f800000;
  QuadMeshNode::QuadMeshNode
            ((QuadMeshNode *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
             in_stack_fffffffffffffaa0,in_stack_fffffffffffffab0,
             CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  local_40d = 0;
  local_328 = &local_3e8;
  local_330 = pp_Var5;
  local_3e8 = pp_Var5;
  if (pp_Var5 != (_func_int **)0x0) {
    (**(code **)(*pp_Var5 + 0x10))();
  }
  local_380 = &local_3f0;
  if (local_3f0 != (long *)0x0) {
    (**(code **)(*local_3f0 + 0x18))();
  }
  local_2f0 = &local_3e8;
  pvVar6 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)(local_3e8 + 0xe),0);
  local_98 = (ulong)local_3dc;
  local_370 = local_98;
  local_368 = pvVar6;
  local_28 = local_98;
  local_20 = pvVar6;
  if (pvVar6->size_alloced < local_98) {
    local_18 = local_98;
    if (pvVar6->size_alloced != 0) {
      local_30 = pvVar6->size_alloced;
      while (local_30 < local_28) {
        local_40[1] = 1;
        local_40[0] = local_30 << 1;
        puVar7 = std::max<unsigned_long>(local_40 + 1,local_40);
        local_30 = *puVar7;
      }
      local_18 = local_30;
    }
  }
  else {
    local_18 = pvVar6->size_alloced;
  }
  local_a0 = local_18;
  uVar4 = local_98;
  if (local_98 < pvVar6->size_active) {
    while (local_a8 = uVar4, local_a8 < pvVar6->size_active) {
      uVar4 = local_a8 + 1;
    }
    pvVar6->size_active = local_98;
  }
  local_90 = pvVar6;
  if (local_18 == pvVar6->size_alloced) {
    for (local_b0 = pvVar6->size_active; local_b0 < local_98; local_b0 = local_b0 + 1) {
      local_88 = pvVar6->items + local_b0;
    }
    pvVar6->size_active = local_98;
  }
  else {
    local_b8 = pvVar6->items;
    local_50 = local_18;
    local_48 = pvVar6;
    pVVar8 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffffa18,(size_t)in_stack_fffffffffffffa10);
    pvVar6->items = pVVar8;
    for (local_c0 = 0; local_c0 < pvVar6->size_active; local_c0 = local_c0 + 1) {
      local_70 = pvVar6->items + local_c0;
      local_78 = local_b8 + local_c0;
      uVar1 = *(undefined8 *)((long)&local_78->field_0 + 8);
      *(undefined8 *)&local_70->field_0 = *(undefined8 *)&local_78->field_0;
      *(undefined8 *)((long)&local_70->field_0 + 8) = uVar1;
    }
    for (local_c8 = pvVar6->size_active; local_c8 < local_98; local_c8 = local_c8 + 1) {
      local_80 = pvVar6->items + local_c8;
    }
    local_68 = pvVar6->size_alloced;
    local_60 = local_b8;
    local_58 = pvVar6;
    alignedFree(in_stack_fffffffffffffa08);
    pvVar6->size_active = local_98;
    pvVar6->size_alloced = local_a0;
  }
  local_274 = (float)local_3d8;
  local_228._4_4_ = 0;
  local_228._0_4_ = local_274;
  local_288 = local_228._0_8_;
  uStack_280 = 0;
  local_1c8 = local_228._0_8_;
  uStack_1c0 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_228._0_8_;
  local_298 = rcpss(auVar2,auVar2);
  local_22c = 0x40000000;
  local_248 = ZEXT416(0x40000000);
  local_168 = local_228._0_8_;
  uStack_160 = 0;
  local_158._0_4_ = local_298._0_4_;
  local_414 = (float)local_158;
  local_158._4_4_ = local_298._4_4_;
  local_158._0_4_ = (float)local_158 * local_274;
  uStack_150 = local_298._8_8_;
  local_108 = local_158;
  uStack_100 = local_298._8_8_;
  fVar9 = 2.0 - (float)local_158;
  local_f8 = (ulong)(uint)fVar9;
  uStack_f0 = 0;
  local_188 = local_f8;
  uStack_180 = 0;
  local_414 = local_414 * fVar9;
  local_178 = CONCAT44(local_158._4_4_,local_414);
  uStack_170 = local_298._8_8_;
  local_1a8 = local_178;
  uStack_1a0 = local_298._8_8_;
  local_29c = (float)local_3d4;
  local_1e8._4_4_ = 0;
  local_1e8._0_4_ = local_29c;
  local_2b8 = local_1e8._0_8_;
  uStack_2b0 = 0;
  local_1b8 = local_1e8._0_8_;
  uStack_1b0 = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_1e8._0_8_;
  local_2c8 = rcpss(auVar3,auVar3);
  local_1ec = 0x40000000;
  local_208 = ZEXT416(0x40000000);
  local_128 = local_1e8._0_8_;
  uStack_120 = 0;
  local_118._0_4_ = local_2c8._0_4_;
  local_418 = (float)local_118;
  local_118._4_4_ = local_2c8._4_4_;
  local_118._0_4_ = (float)local_118 * local_29c;
  uStack_110 = local_2c8._8_8_;
  local_e8 = local_118;
  uStack_e0 = local_2c8._8_8_;
  fVar9 = 2.0 - (float)local_118;
  local_d8 = (ulong)(uint)fVar9;
  uStack_d0 = 0;
  local_148 = local_d8;
  uStack_140 = 0;
  local_418 = local_418 * fVar9;
  local_138 = CONCAT44(local_118._4_4_,local_418);
  uStack_130 = local_2c8._8_8_;
  local_198 = local_138;
  uStack_190 = local_2c8._8_8_;
  local_228 = ZEXT416((uint)local_274);
  local_20c = local_274;
  local_1e8 = ZEXT416((uint)local_29c);
  local_1cc = local_29c;
  for (local_41c = 0; local_41c <= local_3d4; local_41c = local_41c + 1) {
    for (local_420 = 0; fVar9 = local_3bc, local_420 < local_3d8; local_420 = local_420 + 1) {
      local_268 = &pi;
      local_424 = (float)local_41c * 3.1415927 * local_418;
      local_270 = &pi;
      local_428 = (float)local_420 * 2.0 * 3.1415927 * local_414;
      fVar12 = *local_3b8;
      local_254 = local_424;
      fVar10 = sinf(local_424);
      local_258 = local_428;
      fVar11 = sinf(local_428);
      local_2f8 = &local_3e8;
      local_338 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_3e8 + 0xe),0);
      fVar13 = local_3bc;
      local_340 = (ulong)(local_41c * local_3d8 + local_420);
      local_338->items[local_340].field_0.m128[0] = fVar9 * fVar10 * fVar11 + fVar12;
      fVar9 = local_3b8[1];
      local_24c = local_424;
      fVar12 = cosf(local_424);
      fVar9 = fVar13 * fVar12 + fVar9;
      local_300 = &local_3e8;
      local_348 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_3e8 + 0xe),0);
      local_350 = (ulong)(local_41c * local_3d8 + local_420);
      local_348->items[local_350].field_0.m128[1] = fVar9;
      fVar9 = local_3b8[2];
      local_25c = local_424;
      fVar12 = local_3bc;
      fVar13 = sinf(local_424);
      local_250 = local_428;
      fVar10 = cosf(local_428);
      local_308 = &local_3e8;
      local_358 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_3e8 + 0xe),0);
      local_360 = (ulong)(local_41c * local_3d8 + local_420);
      local_358->items[local_360].field_0.m128[2] = fVar12 * fVar13 * fVar10 + fVar9;
    }
    if (local_41c != 0) {
      if (local_41c == 1) {
        for (local_42c = 1; local_42c <= local_3d8; local_42c = local_42c + 1) {
          local_430 = local_3d8 - 1;
          local_434 = (local_41c * local_3d8 + local_42c) - 1;
          local_438 = local_41c * local_3d8 + local_42c % local_3d8;
          local_310 = &local_3e8;
          QuadMeshNode::Quad::Quad(&local_448,local_434,local_430,local_438,local_438);
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::push_back(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        }
      }
      else if (local_41c == local_3d4) {
        for (local_44c = 1; local_44c <= local_3d8; local_44c = local_44c + 1) {
          local_450 = ((local_41c - 1) * local_3d8 + local_44c) - 1;
          local_454 = (local_41c - 1) * local_3d8 + local_44c % local_3d8;
          local_458 = local_3d4 * local_3d8;
          local_318 = &local_3e8;
          QuadMeshNode::Quad::Quad(&local_468,local_458,local_450,local_454,local_454);
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::push_back(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        }
      }
      else {
        for (local_46c = 1; local_46c <= local_3d8; local_46c = local_46c + 1) {
          local_470 = ((local_41c - 1) * local_3d8 + local_46c) - 1;
          local_474 = (local_41c - 1) * local_3d8 + local_46c % local_3d8;
          local_478 = (local_41c * local_3d8 + local_46c) - 1;
          local_47c = local_41c * local_3d8 + local_46c % local_3d8;
          local_320 = &local_3e8;
          QuadMeshNode::Quad::Quad(&local_48c,local_478,local_470,local_474,local_47c);
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::push_back(in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
        }
      }
    }
  }
  local_2e8 = &local_3e8;
  local_10 = local_3e8;
  (in_RDI->super_RefCount)._vptr_RefCount = local_3e8;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_2d8 = &local_3e8;
  if (local_3e8 != (_func_int **)0x0) {
    (**(code **)(*local_3e8 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createQuadSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2*numPhi;
    unsigned numVertices = numTheta*(numPhi+1);
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(numVertices);

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi=0; phi<=numPhi; phi++)
    {
      for (unsigned int theta=0; theta<numTheta; theta++)
      {
	const float phif   = phi*float(pi)*rcpNumPhi;
	const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;
	mesh->positions[0][phi*numTheta+theta].x = center.x + radius*sin(phif)*sin(thetaf);
        mesh->positions[0][phi*numTheta+theta].y = center.y + radius*cos(phif);
	mesh->positions[0][phi*numTheta+theta].z = center.z + radius*sin(phif)*cos(thetaf);
      }
      if (phi == 0) continue;
      
      if (phi == 1)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = numTheta-1;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p11,p11));
	}
      }
      else if (phi == numPhi)
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = numPhi*numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p01,p01));
	}
      }
      else
      {
	for (unsigned int theta=1; theta<=numTheta; theta++) 
	{
	  unsigned int p00 = (phi-1)*numTheta+theta-1;
	  unsigned int p01 = (phi-1)*numTheta+theta%numTheta;
	  unsigned int p10 = phi*numTheta+theta-1;
	  unsigned int p11 = phi*numTheta+theta%numTheta;
          mesh->quads.push_back(QuadMeshNode::Quad(p10,p00,p01,p11));
	}
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }